

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O3

void DumpTiling(PtexFaceData *dh)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RAX;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  byte bVar8;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  tiling: ",10);
  iVar2 = (*dh->_vptr_PtexFaceData[7])(dh);
  if ((char)iVar2 != '\0') {
    uVar3 = (*dh->_vptr_PtexFaceData[8])(dh);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ntiles = ",9);
    uVar4 = (*dh->_vptr_PtexFaceData[4])(dh);
    bVar1 = (byte)(uVar3 & 0xffff);
    bVar8 = (byte)((uVar3 & 0xffff) >> 8);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        (1 << ((char)(uVar4 & 0xffff) - bVar1 & 0x1f)) <<
                        ((char)((uVar4 & 0xffff) >> 8) - bVar8 & 0x1f));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", res = ",8);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)(char)bVar1);
    uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)((long)&uStack_38 + 7),1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)(char)bVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,1 << (bVar1 & 0x1f));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," x ",3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,1 << (bVar8 & 0x1f));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
    return;
  }
  iVar2 = (*dh->_vptr_PtexFaceData[3])(dh);
  if ((char)iVar2 == '\0') {
    pcVar7 = "  (untiled)";
    lVar6 = 0xb;
  }
  else {
    pcVar7 = "  (constant)";
    lVar6 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void DumpTiling(PtexFaceData* dh)
{
    std::cout << "  tiling: ";
    if (dh->isTiled()) {
        Ptex::Res res = dh->tileRes();
        std::cout << "ntiles = " << dh->res().ntiles(res)
                  << ", res = "
                  << int(res.ulog2) << ' ' << int(res.vlog2)
                  << " (" << res.u() << " x " << res.v() << ")\n";
    }
    else if (dh->isConstant()) {
        std::cout << "  (constant)" << std::endl;
    }
    else {
        std::cout << "  (untiled)" << std::endl;
    }
}